

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O3

void r3d::clip<3>(Polytope<3> *poly,Plane<3> *planes,Int nplanes)

{
  Vector<3> *pVVar1;
  Plane<3> *pPVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double dVar6;
  ulong uVar7;
  Polytope<3> *pPVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  Vector<3> *pVVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  Int i;
  uint uVar17;
  long lVar18;
  Vertex<3> *pVVar19;
  Int i_1;
  int iVar20;
  double dVar21;
  double dVar22;
  Vector<3> vr;
  Int clipped [128];
  Real sdists [128];
  UninitT local_6d8 [4];
  UninitT local_6b8;
  UninitT aUStack_6b0 [3];
  double local_698;
  double dStack_690;
  UninitT local_688;
  UninitT local_678 [4];
  double local_658 [4];
  int local_638 [128];
  double adStack_438 [129];
  
  uVar11 = (ulong)(uint)poly->nverts;
  if ((0 < poly->nverts) && (0 < nplanes)) {
    pVVar1 = &poly->verts[0].pos;
    uVar13 = 0;
    do {
      memset(local_638,0,0x200);
      iVar20 = (int)uVar11;
      if (0 < iVar20) {
        pPVar2 = planes + uVar13;
        dVar3 = planes[uVar13].d;
        uVar7 = uVar11 & 0xffffffff;
        uVar10 = 0;
        dVar21 = 1.79769313486232e+308;
        dVar4 = -1.79769313486232e+308;
        do {
          local_688 = poly->verts[uVar10].pos.super_Few<double,_3>.array_[2];
          pdVar15 = (double *)((long)pVVar1 + uVar10 * 0x28);
          local_698 = *pdVar15;
          dStack_690 = pdVar15[1];
          local_6b8 = (pPVar2->n).super_Few<double,_3>.array_[0];
          aUStack_6b0[0] = (pPVar2->n).super_Few<double,_3>.array_[1];
          aUStack_6b0[1] = (pPVar2->n).super_Few<double,_3>.array_[2];
          dVar6 = local_698 * (double)local_6b8;
          lVar14 = 0;
          do {
            dVar6 = dVar6 + (&dStack_690)[lVar14] * (double)aUStack_6b0[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 2);
          dVar6 = dVar6 + dVar3;
          adStack_438[uVar10] = dVar6;
          if (dVar6 < 0.0) {
            local_638[uVar10] = 1;
          }
          dVar22 = dVar6;
          if (dVar21 <= dVar6) {
            dVar22 = dVar21;
          }
          if (dVar6 <= dVar4) {
            dVar6 = dVar4;
          }
          uVar10 = uVar10 + 1;
          dVar21 = dVar22;
          dVar4 = dVar6;
        } while (uVar10 != uVar7);
        if (dVar22 < 0.0) {
          if (dVar6 <= 0.0) {
            poly->nverts = 0;
            return;
          }
          if (0 < iVar20) {
            uVar10 = uVar11 & 0xffffffff;
            uVar11 = 0;
            do {
              if (local_638[uVar11] == 0) {
                pdVar15 = (double *)(uVar11 * 0x28 + (long)pVVar1);
                lVar14 = 0;
                do {
                  iVar9 = poly->verts[uVar11].pnbrs[lVar14];
                  if (local_638[iVar9] != 0) {
                    poly->verts[(int)uVar10].pnbrs[0] = (Int)uVar11;
                    iVar5 = poly->nverts;
                    poly->verts[uVar11].pnbrs[lVar14] = iVar5;
                    local_658[0] = *pdVar15;
                    local_658[1] = pdVar15[1];
                    local_658[2] = pdVar15[2];
                    dVar3 = adStack_438[iVar9];
                    pVVar12 = &poly->verts[iVar9].pos;
                    local_678[0] = (pVVar12->super_Few<double,_3>).array_[0];
                    local_678[1] = (pVVar12->super_Few<double,_3>).array_[1];
                    local_678[2] = poly->verts[iVar9].pos.super_Few<double,_3>.array_[2];
                    dVar4 = adStack_438[uVar11];
                    local_6d8[0] = (UninitT)0x0;
                    local_6d8[1] = (UninitT)0x0;
                    local_6d8[2] = (UninitT)0x0;
                    lVar18 = 0;
                    do {
                      local_6d8[lVar18] =
                           (UninitT)((local_658[lVar18] * -dVar3 + (double)local_678[lVar18] * dVar4
                                     ) / (dVar4 - dVar3));
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 3);
                    lVar18 = 0;
                    do {
                      poly->verts[iVar5].pos.super_Few<double,_3>.array_[lVar18] = local_6d8[lVar18]
                      ;
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 3);
                    uVar10 = (ulong)(iVar5 + 1U);
                    poly->nverts = iVar5 + 1U;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar7);
            iVar9 = (int)uVar10;
            if (iVar20 < iVar9) {
              do {
                uVar11 = uVar7 & 0xffffffff;
                pVVar19 = poly->verts + uVar7;
                do {
                  iVar5 = pVVar19->pnbrs[0];
                  uVar16 = (ulong)iVar5;
                  uVar17 = 1;
                  lVar14 = 0;
                  do {
                    if (poly->verts[uVar16].pnbrs[lVar14] == (int)uVar11) {
                      uVar11 = (ulong)(uVar17 % 3);
                      goto LAB_00290d5c;
                    }
                    lVar14 = lVar14 + 1;
                    uVar17 = uVar17 + 1;
                  } while (lVar14 != 3);
                  uVar11 = 1;
LAB_00290d5c:
                  pVVar19 = (Vertex<3> *)(poly->verts[uVar16].pnbrs + uVar11);
                  uVar11 = uVar16;
                } while (iVar5 < iVar20);
                poly->verts[uVar7].pnbrs[2] = iVar5;
                poly->verts[uVar16].pnbrs[1] = (Int)uVar7;
                uVar7 = uVar7 + 1;
              } while (uVar7 != (long)iVar9);
            }
            if (0 < iVar9) {
              lVar14 = 0;
              uVar11 = 0;
              pVVar12 = pVVar1;
              do {
                if (local_638[lVar14] == 0) {
                  iVar20 = (int)uVar11;
                  pVVar19 = poly->verts + iVar20;
                  pVVar19->pnbrs[2] = poly->verts[lVar14].pnbrs[2];
                  *(undefined8 *)pVVar19->pnbrs = *(undefined8 *)poly->verts[lVar14].pnbrs;
                  lVar18 = 0;
                  do {
                    (pVVar19->pos).super_Few<double,_3>.array_[lVar18] =
                         (pVVar12->super_Few<double,_3>).array_[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  local_638[lVar14] = iVar20;
                  uVar11 = (ulong)(iVar20 + 1);
                  uVar10 = (ulong)(uint)poly->nverts;
                }
                lVar14 = lVar14 + 1;
                pVVar12 = (Vector<3> *)((long)(pVVar12 + 1) + 0x10);
              } while (lVar14 < (int)uVar10);
              poly->nverts = (int)uVar11;
              if (0 < (int)uVar11) {
                lVar14 = 0;
                pPVar8 = poly;
                do {
                  lVar18 = 0;
                  do {
                    pPVar8->verts[0].pnbrs[lVar18] = local_638[pPVar8->verts[0].pnbrs[lVar18]];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  lVar14 = lVar14 + 1;
                  uVar11 = (ulong)poly->nverts;
                  pPVar8 = (Polytope<3> *)(pPVar8->verts + 1);
                } while (lVar14 < (long)uVar11);
              }
              goto LAB_00290d85;
            }
          }
          poly->nverts = 0;
          uVar11 = 0;
        }
      }
LAB_00290d85:
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)nplanes);
  }
  return;
}

Assistant:

R3D_INLINE void clip(
    Polytope<dim>& poly, Plane<dim> const* planes, Int nplanes) {
  if (poly.nverts <= 0) return;

  // variable declarations
  Int v, p, np, onv, vcur, vnext, numunclipped;

  // signed distances to the clipping plane
  Real sdists[Polytope<dim>::max_verts];
  Real smin, smax;

  // loop over each clip plane
  for (p = 0; p < nplanes; ++p) {
    // calculate signed distances to the clip plane
    onv = poly.nverts;
    smin = ArithTraits<Real>::max();
    smax = ArithTraits<Real>::min();

    // for marking clipped vertices
    Int clipped[MaxVerts<dim>::value] = {};  // all initialized to zero
    for (v = 0; v < onv; ++v) {
      sdists[v] = planes[p].d + (poly.verts[v].pos * planes[p].n);
      if (sdists[v] < smin) smin = sdists[v];
      if (sdists[v] > smax) smax = sdists[v];
      if (sdists[v] < 0.0) clipped[v] = 1;
    }

    // skip this face if the poly lies entirely on one side of it
    if (smin >= 0.0) continue;
    if (smax <= 0.0) {
      poly.nverts = 0;
      return;
    }

    // check all edges and insert new vertices on the bisected edges
    for (vcur = 0; vcur < onv; ++vcur) {
      if (clipped[vcur]) continue;
      for (np = 0; np < dim; ++np) {
        vnext = poly.verts[vcur].pnbrs[np];
        if (!clipped[vnext]) continue;
        ClipHelper<dim>::init_new_vert_link(poly, vcur, np);
        poly.verts[vcur].pnbrs[np] = poly.nverts;
        poly.verts[poly.nverts].pos = wav(poly.verts[vcur].pos, -sdists[vnext],
            poly.verts[vnext].pos, sdists[vcur]);
        ++(poly.nverts);
      }
    }

    // for each new vert, search around the poly for its new neighbors
    // and doubly-link everything
    ClipHelper<dim>::finalize_links(onv, poly);

    // go through and compress the vertex list, removing clipped verts
    // and re-indexing accordingly (reusing `clipped` to re-index everything)
    numunclipped = 0;
    for (v = 0; v < poly.nverts; ++v) {
      if (!clipped[v]) {
        poly.verts[numunclipped] = poly.verts[v];
        clipped[v] = numunclipped++;
      }
    }
    poly.nverts = numunclipped;
    for (v = 0; v < poly.nverts; ++v)
      for (np = 0; np < dim; ++np)
        poly.verts[v].pnbrs[np] = clipped[poly.verts[v].pnbrs[np]];
  }
}